

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::Object>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::Object> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  FastAllocator *this_00;
  ThreadLocal *pTVar3;
  ThreadLocal2 *this_01;
  iterator __position;
  UserGeometry *pUVar4;
  undefined1 auVar5 [16];
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  undefined1 auVar14 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar15;
  BBox3fa box;
  MutexSys *local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_98;
  ThreadLocal2 *local_88;
  uint local_80;
  undefined4 local_7c;
  MutexSys **local_78;
  ThreadLocal2 *local_70;
  MutexSys *local_68;
  char cStack_60;
  undefined7 uStack_5f;
  undefined1 local_58 [16];
  range<unsigned_int> *local_40;
  NodeRecord *local_38;
  
  local_98._8_8_ = local_98._0_8_;
  uVar10 = CONCAT44(0,current->_begin);
  uVar9 = current->_end;
  uVar8 = (ulong)(uVar9 - current->_begin);
  local_b8 = (MutexSys *)(uVar8 * 8);
  this_00 = alloc->alloc;
  pTVar3 = alloc->talloc1;
  this_01 = pTVar3->parent;
  local_38 = __return_storage_ptr__;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_a8._0_4_ = uVar9;
    local_98._0_8_ = uVar10;
    local_80 = CONCAT31(local_80._1_3_,1);
    local_88 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_68 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    cStack_60 = '\x01';
    local_70 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_70);
    }
    else {
      *__position._M_current = local_70;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (cStack_60 == '\x01') {
      MutexSys::unlock(local_68);
    }
    if ((char)local_80 == '\x01') {
      MutexSys::unlock(&local_88->mutex);
    }
    uVar10 = local_98._0_8_;
    uVar9 = local_a8._0_4_;
  }
  pTVar3->bytesUsed = (long)&local_b8->mutex + pTVar3->bytesUsed;
  sVar6 = pTVar3->cur;
  uVar7 = (ulong)(-(int)sVar6 & 0xf);
  uVar11 = (long)&local_b8->mutex + uVar7 + sVar6;
  pTVar3->cur = uVar11;
  local_b0 = uVar8;
  local_40 = current;
  if (pTVar3->end < uVar11) {
    local_a8._0_4_ = uVar9;
    local_98._0_8_ = uVar10;
    pTVar3->cur = sVar6;
    if ((MutexSys *)pTVar3->allocBlockSize < (MutexSys *)((long)local_b8 << 2)) {
      pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&local_b8);
    }
    else {
      local_68 = (MutexSys *)pTVar3->allocBlockSize;
      pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&local_68);
      pTVar3->ptr = pcVar12;
      sVar6 = (pTVar3->end - pTVar3->cur) + pTVar3->bytesWasted;
      pTVar3->bytesWasted = sVar6;
      pTVar3->cur = 0;
      pTVar3->end = (size_t)local_68;
      pTVar3->cur = (size_t)local_b8;
      if (local_68 < local_b8) {
        pTVar3->cur = 0;
        local_68 = (MutexSys *)pTVar3->allocBlockSize;
        pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&local_68);
        pTVar3->ptr = pcVar12;
        sVar6 = (pTVar3->end - pTVar3->cur) + pTVar3->bytesWasted;
        pTVar3->bytesWasted = sVar6;
        pTVar3->cur = 0;
        pTVar3->end = (size_t)local_68;
        pTVar3->cur = (size_t)local_b8;
        uVar8 = local_b0;
        if (local_68 < local_b8) {
          pTVar3->cur = 0;
          pcVar12 = (char *)0x0;
        }
        else {
          pTVar3->bytesWasted = sVar6;
        }
      }
      else {
        pTVar3->bytesWasted = sVar6;
      }
    }
    uVar10 = local_98._0_8_;
  }
  else {
    pTVar3->bytesWasted = pTVar3->bytesWasted + uVar7;
    pcVar12 = pTVar3->ptr + (uVar11 - (long)local_b8);
    local_a8._0_4_ = uVar9;
  }
  local_98 = _DAT_01feba00;
  if (local_a8._0_4_ == (uint)uVar10) {
    auVar14 = DAT_01feb9f0._0_12_;
  }
  else {
    pUVar4 = this->mesh;
    lVar13 = 0;
    local_a8 = _DAT_01feb9f0;
    do {
      uVar9 = this->morton[uVar10 + lVar13].field_0.field_0.index;
      local_88 = (ThreadLocal2 *)(pUVar4->super_AccelSet).super_Geometry.userPtr;
      local_7c = 0;
      local_78 = &local_68;
      local_80 = uVar9;
      (**(code **)&(pUVar4->super_AccelSet).super_Geometry.field_0x58)(&local_88);
      auVar5[8] = cStack_60;
      auVar5._0_8_ = local_68;
      auVar5._9_7_ = uStack_5f;
      local_a8 = minps(local_a8,auVar5);
      auVar14 = local_a8._0_12_;
      local_98.m128 = (__m128)maxps(local_98.m128,local_58);
      *(uint *)(pcVar12 + lVar13 * 8) = this->geomID_;
      *(uint *)(pcVar12 + lVar13 * 8 + 4) = uVar9;
      lVar13 = lVar13 + 1;
    } while (uVar8 + (uVar8 == 0) != lVar13);
  }
  uVar8 = 7;
  if (local_b0 < 7) {
    uVar8 = local_b0;
  }
  aVar15.m128[3] = (float)(local_40->_end - local_40->_begin);
  aVar15._0_12_ = auVar14;
  (local_38->ref).ptr = uVar8 | (ulong)pcVar12 | 8;
  (local_38->bounds).lower.field_0 = aVar15;
  (local_38->bounds).upper.field_0 = local_98;
  return local_38;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        
        /* allocate leaf node */
        Object* accel = (Object*) alloc.malloc1(items*sizeof(Object),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const UserGeometry* mesh = this->mesh;
        
        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int index = morton[start+i].index;
          const unsigned int primID = index; 
          bounds.extend(mesh->bounds(primID));
          new (&accel[i]) Object(geomID_,primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }